

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

String * __thiscall
capnp::compiler::CompilerMain::readOneJson
          (String *__return_storage_ptr__,CompilerMain *this,BufferedInputStreamWrapper *input)

{
  byte bVar1;
  bool bVar2;
  RemoveConst<char> *pRVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  size_t __n;
  size_t __n_00;
  size_t sVar6;
  char *pcVar7;
  char cVar8;
  bool bVar9;
  Vector<char> chars;
  Vector<char> local_68;
  uint local_48;
  int local_44;
  String *local_40;
  BufferedInputStreamWrapper *local_38;
  void *__src;
  
  local_68.builder.ptr = (char *)0x0;
  local_68.builder.pos = (char *)0x0;
  local_68.builder.endPtr = (char *)0x0;
  local_68.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  local_48 = 0;
  local_44 = 0;
  cVar8 = '\0';
  local_40 = __return_storage_ptr__;
  local_38 = input;
  do {
    iVar4 = (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[4])(input);
    __src = (void *)CONCAT44(extraout_var,iVar4);
    if (__n == 0) {
      if (local_68.builder.pos == local_68.builder.endPtr) {
        sVar6 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
        if (local_68.builder.endPtr == local_68.builder.ptr) {
          sVar6 = 4;
        }
        kj::Vector<char>::setCapacity(&local_68,sVar6);
      }
      *local_68.builder.pos = '\0';
      local_68.builder.pos = local_68.builder.pos + 1;
      if (local_68.builder.pos != local_68.builder.endPtr) {
        kj::Vector<char>::setCapacity
                  (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
      }
      pcVar5 = local_68.builder.ptr;
      sVar6 = (long)local_68.builder.pos - (long)local_68.builder.ptr;
      local_68.builder.ptr = (char *)0x0;
      local_68.builder.pos = (char *)0x0;
      local_68.builder.endPtr = (char *)0x0;
      (local_40->content).ptr = pcVar5;
      (local_40->content).size_ = sVar6;
      (local_40->content).disposer = local_68.builder.disposer;
LAB_001222e4:
      bVar9 = false;
    }
    else {
      bVar9 = false;
      __n_00 = 0;
      iVar4 = local_44;
      do {
        bVar1 = *(byte *)((long)__src + __n_00);
        if (cVar8 != '\0') {
          if (cVar8 == '\x02') {
            cVar8 = (bVar1 != 10) * '\x02';
          }
          else {
            if (0x7a < bVar1) goto LAB_00122085;
            if ((bVar1 == 0x23) || (bVar1 == 0x2f)) goto LAB_0012207a;
          }
          goto LAB_001221bf;
        }
        if (bVar1 < 0x7b) {
          bVar2 = true;
          if (bVar1 == 0x23) {
LAB_0012207a:
            bVar2 = true;
            cVar8 = '\x02';
          }
          else {
            if (bVar1 != 0x2f) goto LAB_001221bf;
            cVar8 = '\x01';
          }
        }
        else {
LAB_00122085:
          if (bVar1 == 0x7b) {
            if ((iVar4 != 0) || ((local_48 & 1) == 0)) {
              iVar4 = iVar4 + 1;
              goto LAB_001221bf;
            }
            pcVar5 = local_68.builder.pos + (__n_00 - (long)local_68.builder.ptr);
            if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pcVar5) {
              pcVar7 = (char *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
              if (local_68.builder.endPtr == local_68.builder.ptr) {
                pcVar7 = (char *)0x4;
              }
              if (pcVar7 < pcVar5) {
                pcVar7 = pcVar5;
              }
              kj::Vector<char>::setCapacity(&local_68,(size_t)pcVar7);
            }
            pRVar3 = local_68.builder.pos;
            if (__n_00 != 0) {
              memcpy(local_68.builder.pos,__src,__n_00);
            }
            local_68.builder.pos = pRVar3 + __n_00;
            if (local_68.builder.pos == local_68.builder.endPtr) {
              sVar6 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
              if (local_68.builder.endPtr == local_68.builder.ptr) {
                sVar6 = 4;
              }
              kj::Vector<char>::setCapacity(&local_68,sVar6);
            }
            input = local_38;
            *local_68.builder.pos = '\0';
            local_68.builder.pos = local_68.builder.pos + 1;
            (*(local_38->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])
                      (local_38,__n_00);
            if (local_68.builder.pos != local_68.builder.endPtr) {
              kj::Vector<char>::setCapacity
                        (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
            }
            pcVar5 = local_68.builder.ptr;
            sVar6 = (long)local_68.builder.pos - (long)local_68.builder.ptr;
            local_68.builder.ptr = (char *)0x0;
            local_68.builder.pos = (char *)0x0;
            local_68.builder.endPtr = (char *)0x0;
            (local_40->content).ptr = pcVar5;
            (local_40->content).size_ = sVar6;
            (local_40->content).disposer = local_68.builder.disposer;
            bVar2 = false;
            iVar4 = 0;
          }
          else if (bVar1 == 0x7d) {
            bVar2 = true;
            if (iVar4 == 0) {
              iVar4 = 0;
            }
            else {
              iVar4 = iVar4 + -1;
              local_48 = local_48 & 0xff;
              if (iVar4 == 0) {
                local_48 = 1;
              }
            }
          }
          else {
LAB_001221bf:
            bVar2 = true;
          }
        }
        if (!bVar2) break;
        __n_00 = __n_00 + 1;
        bVar9 = __n == __n_00;
      } while (!bVar9);
      local_44 = iVar4;
      if (!bVar9) goto LAB_001222e4;
      pcVar5 = local_68.builder.pos + (__n - (long)local_68.builder.ptr);
      if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pcVar5) {
        pcVar7 = (char *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
        if (local_68.builder.endPtr == local_68.builder.ptr) {
          pcVar7 = (char *)0x4;
        }
        if (pcVar7 < pcVar5) {
          pcVar7 = pcVar5;
        }
        kj::Vector<char>::setCapacity(&local_68,(size_t)pcVar7);
      }
      pRVar3 = local_68.builder.pos;
      memcpy(local_68.builder.pos,__src,__n);
      input = local_38;
      local_68.builder.pos = pRVar3 + __n;
      bVar9 = true;
      (*(local_38->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])(local_38,__n);
    }
    pcVar7 = local_68.builder.endPtr;
    pRVar3 = local_68.builder.pos;
    pcVar5 = local_68.builder.ptr;
    if (!bVar9) {
      if (local_68.builder.ptr != (char *)0x0) {
        local_68.builder.ptr = (char *)0x0;
        local_68.builder.pos = (RemoveConst<char> *)0x0;
        local_68.builder.endPtr = (char *)0x0;
        (**(local_68.builder.disposer)->_vptr_ArrayDisposer)
                  (local_68.builder.disposer,pcVar5,1,(long)pRVar3 - (long)pcVar5,
                   (long)pcVar7 - (long)pcVar5,0);
      }
      return local_40;
    }
  } while( true );
}

Assistant:

kj::String readOneJson(kj::BufferedInputStreamWrapper& input) {
    // Consume and return one brace-delimited message from the input.
    //
    // Accounts for nested braces, string literals, and comments starting with # or //. Technically
    // JSON does not permit comments but this code is lenient in case we change things later.

    enum {
      NORMAL,
      SLASH,
      COMMENT,
      QUOTE,
      QUOTE_ESCAPE,
      DQUOTE,
      DQUOTE_ESCAPE
    } state = NORMAL;
    uint depth = 0;
    bool sawClose = false;

    kj::Vector<char> chars;

    for (;;) {
      auto buffer = input.tryGetReadBuffer();

      if (buffer == nullptr) {
        // EOF
        chars.add('\0');
        return kj::String(chars.releaseAsArray());
      }

      for (auto i: kj::indices(buffer)) {
        char c = buffer[i];
        switch (state) {
          case SLASH:
            if (c == '/') {
              state = COMMENT;
              break;
            }
            KJ_FALLTHROUGH;
          case NORMAL:
            switch (c) {
              case '#': state = COMMENT; break;
              case '/': state = SLASH; break;
              case '{':
                if (depth == 0 && sawClose) {
                  // We already got one complete message. This is the start of the next message.
                  // Stop here.
                  chars.addAll(buffer.first(i));
                  chars.add('\0');
                  input.skip(i);
                  return kj::String(chars.releaseAsArray());
                }
                ++depth;
                break;
              case '}':
                if (depth > 0) {
                  if (--depth == 0) {
                    sawClose = true;
                  }
                }
                break;
              default: break;
            }
            break;
          case COMMENT:
            switch (c) {
              case '\n': state = NORMAL; break;
              default: break;
            }
            break;
          case QUOTE:
            switch (c) {
              case '\'': state = NORMAL; break;
              case '\\': state = QUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case QUOTE_ESCAPE:
            break;
          case DQUOTE:
            switch (c) {
              case '\"': state = NORMAL; break;
              case '\\': state = DQUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case DQUOTE_ESCAPE:
            break;
        }
      }

      chars.addAll(buffer);
      input.skip(buffer.size());
    }
  }